

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void __thiscall coins_tests::ccoins_write::test_method(ccoins_write *this)

{
  char parent_flags;
  long lVar1;
  long parent_value;
  long child_value;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  const_iterator __end3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckWriteCoins(-2,-2,-2,-1,-1,-1);
  CheckWriteCoins(-2,-1,-1,-1,'\x01','\x01');
  CheckWriteCoins(-2,-1,-2,-1,'\x03',-1);
  CheckWriteCoins(-2,200,200,-1,'\x01','\x01');
  CheckWriteCoins(-2,200,200,-1,'\x03','\x03');
  lVar5 = 0;
  CheckWriteCoins(-1,-2,-1,'\0',-1,'\0');
  CheckWriteCoins(-1,-2,-1,'\x02',-1,'\x02');
  CheckWriteCoins(-1,-2,-1,'\x01',-1,'\x01');
  CheckWriteCoins(-1,-2,-1,'\x03',-1,'\x03');
  CheckWriteCoins(-1,-1,-1,'\0','\x01','\x01');
  CheckWriteCoins(-1,-1,-1,'\0','\x03','\x01');
  CheckWriteCoins(-1,-1,-2,'\x02','\x01',-1);
  CheckWriteCoins(-1,-1,-2,'\x02','\x03',-1);
  CheckWriteCoins(-1,-1,-1,'\x01','\x01','\x01');
  CheckWriteCoins(-1,-1,-1,'\x01','\x03','\x01');
  CheckWriteCoins(-1,-1,-2,'\x03','\x01',-1);
  CheckWriteCoins(-1,-1,-2,'\x03','\x03',-1);
  CheckWriteCoins(-1,200,200,'\0','\x01','\x01');
  CheckWriteCoins(-1,200,200,'\0','\x03','\x01');
  CheckWriteCoins(-1,200,200,'\x02','\x01','\x03');
  CheckWriteCoins(-1,200,200,'\x02','\x03','\x03');
  CheckWriteCoins(-1,200,200,'\x01','\x01','\x01');
  CheckWriteCoins(-1,200,200,'\x01','\x03','\x01');
  CheckWriteCoins(-1,200,200,'\x03','\x01','\x03');
  CheckWriteCoins(-1,200,200,'\x03','\x03','\x03');
  CheckWriteCoins(100,-2,100,'\0',-1,'\0');
  CheckWriteCoins(100,-2,100,'\x02',-1,'\x02');
  CheckWriteCoins(100,-2,100,'\x01',-1,'\x01');
  CheckWriteCoins(100,-2,100,'\x03',-1,'\x03');
  CheckWriteCoins(100,-1,-1,'\0','\x01','\x01');
  CheckWriteCoins(100,-1,-3,'\0','\x03',-1);
  CheckWriteCoins(100,-1,-2,'\x02','\x01',-1);
  CheckWriteCoins(100,-1,-3,'\x02','\x03',-1);
  CheckWriteCoins(100,-1,-1,'\x01','\x01','\x01');
  CheckWriteCoins(100,-1,-3,'\x01','\x03',-1);
  CheckWriteCoins(100,-1,-2,'\x03','\x01',-1);
  CheckWriteCoins(100,-1,-3,'\x03','\x03',-1);
  CheckWriteCoins(100,200,200,'\0','\x01','\x01');
  CheckWriteCoins(100,200,-3,'\0','\x03',-1);
  CheckWriteCoins(100,200,200,'\x02','\x01','\x03');
  CheckWriteCoins(100,200,-3,'\x02','\x03',-1);
  CheckWriteCoins(100,200,200,'\x01','\x01','\x01');
  CheckWriteCoins(100,200,-3,'\x01','\x03',-1);
  CheckWriteCoins(100,200,200,'\x03','\x01','\x03');
  CheckWriteCoins(100,200,-3,'\x03','\x03',-1);
  do {
    parent_value = *(long *)((long)&DAT_00e6d7d0 + lVar5);
    pcVar4 = "";
    if (parent_value == -2) {
      pcVar4 = &_ZGRN11coins_testsL12ABSENT_FLAGSE_;
    }
    lVar3 = 0;
    do {
      child_value = *(long *)((long)&DAT_00e6d768 + lVar3);
      puVar7 = &_ZGRN11coins_testsL11CLEAN_FLAGSE_;
      if (child_value == -2) {
        puVar7 = &_ZGRN11coins_testsL12ABSENT_FLAGSE_;
      }
      pcVar2 = pcVar4;
      do {
        parent_flags = *pcVar2;
        lVar6 = 0;
        do {
          CheckWriteCoins(parent_value,child_value,parent_value,parent_flags,puVar7[lVar6],
                          parent_flags);
          lVar6 = lVar6 + 1;
        } while ((ulong)(child_value != -2) + 1 != lVar6);
        pcVar2 = pcVar2 + 1;
      } while (pcVar2 != pcVar4 + (ulong)(parent_value != -2) * 3 + 1);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_write)
{
    /* Check BatchWrite behavior, flushing one entry from a child cache to a
     * parent cache, and checking the resulting entry in the parent cache
     * after the write.
     *
     *              Parent  Child   Result  Parent       Child        Result
     *              Value   Value   Value   Flags        Flags        Flags
     */
    CheckWriteCoins(ABSENT, ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   , NO_ENTRY   );
    CheckWriteCoins(ABSENT, SPENT , SPENT , NO_ENTRY   , DIRTY      , DIRTY      );
    CheckWriteCoins(ABSENT, SPENT , ABSENT, NO_ENTRY   , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(ABSENT, VALUE2, VALUE2, NO_ENTRY   , DIRTY      , DIRTY      );
    CheckWriteCoins(ABSENT, VALUE2, VALUE2, NO_ENTRY   , DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(SPENT , ABSENT, SPENT , 0          , NO_ENTRY   , 0          );
    CheckWriteCoins(SPENT , ABSENT, SPENT , FRESH      , NO_ENTRY   , FRESH      );
    CheckWriteCoins(SPENT , ABSENT, SPENT , DIRTY      , NO_ENTRY   , DIRTY      );
    CheckWriteCoins(SPENT , ABSENT, SPENT , DIRTY|FRESH, NO_ENTRY   , DIRTY|FRESH);
    CheckWriteCoins(SPENT , SPENT , SPENT , 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , SPENT , SPENT , 0          , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , SPENT , ABSENT, FRESH      , DIRTY      , NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , ABSENT, FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, DIRTY      , NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, 0          , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, FRESH      , DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, FRESH      , DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, 0          , NO_ENTRY   , 0          );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, FRESH      , NO_ENTRY   , FRESH      );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, DIRTY      , NO_ENTRY   , DIRTY      );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, DIRTY|FRESH, NO_ENTRY   , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, SPENT , SPENT , 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , 0          , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , ABSENT, FRESH      , DIRTY      , NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , SPENT , DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , DIRTY      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , ABSENT, DIRTY|FRESH, DIRTY      , NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , 0          , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, FRESH      , DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , DIRTY      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, DIRTY|FRESH, DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );

    // The checks above omit cases where the child flags are not DIRTY, since
    // they would be too repetitive (the parent cache is never updated in these
    // cases). The loop below covers these cases and makes sure the parent cache
    // is always left unchanged.
    for (const CAmount parent_value : {ABSENT, SPENT, VALUE1})
        for (const CAmount child_value : {ABSENT, SPENT, VALUE2})
            for (const char parent_flags : parent_value == ABSENT ? ABSENT_FLAGS : FLAGS)
                for (const char child_flags : child_value == ABSENT ? ABSENT_FLAGS : CLEAN_FLAGS)
                    CheckWriteCoins(parent_value, child_value, parent_value, parent_flags, child_flags, parent_flags);
}